

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError file2string(char **bufp,FILE *file)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  size_t buflen;
  size_t stringlen;
  char *string;
  char *ptr;
  char buffer [256];
  FILE *file_local;
  char **bufp_local;
  
  stringlen = 0;
  buflen = 0;
  if (file != (FILE *)0x0) {
    while (pcVar1 = fgets((char *)&ptr,0x100,(FILE *)file), pcVar1 != (char *)0x0) {
      pcVar1 = strchr((char *)&ptr,0xd);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      pcVar1 = strchr((char *)&ptr,10);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      sVar2 = strlen((char *)&ptr);
      pvVar3 = realloc((void *)stringlen,buflen + sVar2 + 1);
      if (pvVar3 == (void *)0x0) {
        if (stringlen != 0) {
          free((void *)stringlen);
        }
        return PARAM_NO_MEM;
      }
      strcpy((char *)((long)pvVar3 + buflen),(char *)&ptr);
      buflen = sVar2 + buflen;
      stringlen = (size_t)pvVar3;
    }
  }
  *bufp = (char *)stringlen;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  char buffer[256];
  char *ptr;
  char *string = NULL;
  size_t stringlen = 0;
  size_t buflen;

  if(file) {
    while(fgets(buffer, sizeof(buffer), file)) {
      if((ptr = strchr(buffer, '\r')) != NULL)
        *ptr = '\0';
      if((ptr = strchr(buffer, '\n')) != NULL)
        *ptr = '\0';
      buflen = strlen(buffer);
      if((ptr = realloc(string, stringlen+buflen+1)) == NULL) {
        Curl_safefree(string);
        return PARAM_NO_MEM;
      }
      string = ptr;
      strcpy(string+stringlen, buffer);
      stringlen += buflen;
    }
  }
  *bufp = string;
  return PARAM_OK;
}